

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swish.c
# Opt level: O2

rt_function_error_t exec_swish_generic(rt_function_t *f)

{
  undefined8 *puVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  
  puVar1 = (undefined8 *)f->local_context;
  for (iVar2 = 0; iVar2 < *(int *)(puVar1 + 5); iVar2 = iVar2 + 1) {
    fVar3 = (float)(*(code *)puVar1[1])(*puVar1,iVar2);
    fVar4 = expf(-fVar3);
    (*(code *)puVar1[4])((1.0 / (fVar4 + 1.0)) * fVar3,puVar1[3],iVar2);
  }
  return RT_FUNCTION_ERROR_NOERROR;
}

Assistant:

rt_function_error_t exec_swish_generic(rt_function_t *f) {
  swish_local_context_t *c = (swish_local_context_t *)(f->local_context);

  int i; // Iterator
  for (i = 0; i < c->output_size; i++) {
    float x = c->get_input(c->input, i);
    float y = x * (1.0f / (1.0f + expf(-x)));
    c->set_output(c->output, i, y);
  }
  return RT_FUNCTION_ERROR_NOERROR;
}